

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O1

void __thiscall tcpp::StringInputStream::StringInputStream(StringInputStream *this,string *source)

{
  pointer pcVar1;
  
  (this->super_IInputStream)._vptr_IInputStream = (_func_int **)&PTR__StringInputStream_001c1b18;
  (this->mSourceStr)._M_dataplus._M_p = (pointer)&(this->mSourceStr).field_2;
  pcVar1 = (source->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mSourceStr,pcVar1,pcVar1 + source->_M_string_length);
  return;
}

Assistant:

StringInputStream::StringInputStream(const std::string& source) TCPP_NOEXCEPT:
		IInputStream(), mSourceStr(source)
	{
	}